

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O1

shared_ptr<JointPolicyPureVector> __thiscall
boost::dynamic_pointer_cast<JointPolicyPureVector,PartialJointPolicyDiscretePure>
          (boost *this,shared_ptr<PartialJointPolicyDiscretePure> *r)

{
  long lVar1;
  shared_count in_RDX;
  undefined1 auVar2 [16];
  shared_ptr<JointPolicyPureVector> sVar3;
  
  if (*(long *)r == 0) {
    lVar1 = 0;
  }
  else {
    auVar2 = __dynamic_cast(*(long *)r,&PartialJointPolicyDiscretePure::typeinfo,
                            &JointPolicyPureVector::typeinfo,0xfffffffffffffffe);
    in_RDX.pi_ = auVar2._8_8_;
    lVar1 = auVar2._0_8_;
  }
  if (lVar1 == 0) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    *(long *)this = lVar1;
    lVar1 = *(long *)(r + 8);
    *(long *)(this + 8) = lVar1;
    if (lVar1 != 0) {
      LOCK();
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      UNLOCK();
    }
  }
  sVar3.pn.pi_ = in_RDX.pi_;
  sVar3.px = (element_type *)this;
  return sVar3;
}

Assistant:

shared_ptr<T> dynamic_pointer_cast( shared_ptr<U> const & r ) BOOST_NOEXCEPT
{
    (void) dynamic_cast< T* >( static_cast< U* >( 0 ) );

    typedef typename shared_ptr<T>::element_type E;

    E * p = dynamic_cast< E* >( r.get() );
    return p? shared_ptr<T>( r, p ): shared_ptr<T>();
}